

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O3

xmlHashedString xmlDictLookupHashed(xmlDictPtr dict,xmlChar *name,int len)

{
  xmlDictEntry *pxVar1;
  xmlChar *pxVar2;
  uint uVar3;
  xmlHashedString xVar4;
  
  uVar3 = 0;
  pxVar1 = xmlDictLookupInternal(dict,(xmlChar *)0x0,name,len,1);
  pxVar2 = (xmlChar *)0x0;
  if (pxVar1 != (xmlDictEntry *)0x0) {
    uVar3 = pxVar1->hashValue;
    pxVar2 = pxVar1->name;
  }
  xVar4._4_4_ = 0;
  xVar4.hashValue = uVar3;
  xVar4.name = pxVar2;
  return xVar4;
}

Assistant:

xmlHashedString
xmlDictLookupHashed(xmlDictPtr dict, const xmlChar *name, int len) {
    const xmlDictEntry *entry;
    xmlHashedString ret;

    entry = xmlDictLookupInternal(dict, NULL, name, len, 1);

    if (entry == NULL) {
        ret.name = NULL;
        ret.hashValue = 0;
    } else {
        ret = *entry;
    }

    return(ret);
}